

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlstring.c
# Opt level: O2

xmlChar * xmlUTF8Strsub(xmlChar *utf,int start,int len)

{
  int iVar1;
  xmlChar *pxVar2;
  byte bVar3;
  
  if (-1 < (len | start) && utf != (xmlChar *)0x0) {
    iVar1 = 0;
    if (start < 1) {
      start = 0;
      iVar1 = 0;
    }
    while( true ) {
      if (iVar1 == start) {
        pxVar2 = xmlUTF8Strndup(utf,len);
        return pxVar2;
      }
      bVar3 = *utf;
      if (bVar3 == 0) break;
      utf = utf + 1;
      if ((char)bVar3 < '\0') {
        for (; (bVar3 & 0x40) != 0; bVar3 = bVar3 * '\x02') {
          if (*utf == 0) {
            return (xmlChar *)0x0;
          }
          utf = utf + 1;
        }
      }
      iVar1 = iVar1 + 1;
    }
  }
  return (xmlChar *)0x0;
}

Assistant:

xmlChar *
xmlUTF8Strsub(const xmlChar *utf, int start, int len) {
    int i;
    int ch;

    if (utf == NULL) return(NULL);
    if (start < 0) return(NULL);
    if (len < 0) return(NULL);

    /*
     * Skip over any leading chars
     */
    for (i = 0; i < start; i++) {
        ch = *utf++;
        if (ch == 0)
            return(NULL);
        /* skip over remaining bytes for this char */
        if (ch & 0x80) {
            ch <<= 1;
            while (ch & 0x80) {
                if (*utf++ == 0)
                    return(NULL);
                ch <<= 1;
            }
        }
    }

    return(xmlUTF8Strndup(utf, len));
}